

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void __thiscall
helics::Federate::handleError(Federate *this,int errorCode,string_view errorString,bool noThrow)

{
  FederateError *this_00;
  int local_3c;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  updateFederateMode(this,ERROR_STATE);
  if ((this->errorHandlerCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
    if (!noThrow) {
      this_00 = (FederateError *)__cxa_allocate_exception(0x30);
      FederateError::FederateError(this_00,errorCode,errorString);
      __cxa_throw(this_00,&FederateError::typeinfo,HelicsException::~HelicsException);
    }
  }
  else {
    local_3c = errorCode;
    local_38._M_len = errorString._M_len;
    local_38._M_str = errorString._M_str;
    (*(this->errorHandlerCallback)._M_invoker)
              ((_Any_data *)&this->errorHandlerCallback,&local_3c,&local_38);
  }
  return;
}

Assistant:

void Federate::handleError(int errorCode, std::string_view errorString, bool noThrow)
{
    updateFederateMode(Modes::ERROR_STATE);

    if (errorHandlerCallback) {
        errorHandlerCallback(errorCode, errorString);
    } else if (!noThrow) {
        throw FederateError(errorCode, errorString);
    }
}